

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serfloat_tests.cpp
# Opt level: O0

uint64_t serfloat_tests::anon_unknown_4::TestDouble(double f)

{
  bool bVar1;
  uint uVar2;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  uint64_t i2;
  double f2;
  uint64_t i;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffd78;
  lazy_ostream *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  uint64_t in_stack_fffffffffffffd90;
  double in_stack_fffffffffffffd98;
  const_string *in_stack_fffffffffffffda0;
  size_t in_stack_fffffffffffffda8;
  size_t line_num;
  const_string *in_stack_fffffffffffffdb0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffdb8;
  unit_test_log_t *this;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [32];
  unit_test_log_t local_188 [2];
  undefined1 local_118 [40];
  assertion_result local_d0 [2];
  const_string local_98 [2];
  lazy_ostream local_78 [2];
  assertion_result local_58 [2];
  lazy_ostream local_20;
  double local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_XMM0_Qa;
  local_20._8_8_ = EncodeDouble(in_stack_fffffffffffffd98);
  local_20._vptr_lazy_ostream = (_func_int **)DecodeDouble(in_stack_fffffffffffffd90);
  uVar2 = std::isnan(local_10);
  if ((uVar2 & 1) == 0) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
                 (pointer)in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd78);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                 in_stack_fffffffffffffda0);
      std::isnan((double)local_20._vptr_lazy_ostream);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffd88,
                 SUB81((ulong)in_stack_fffffffffffffd80 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
                 (pointer)in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
      boost::unit_test::operator<<
                (in_stack_fffffffffffffd80,(basic_cstring<const_char> *)in_stack_fffffffffffffd78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
                 (pointer)in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
      in_stack_fffffffffffffd78 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_d0,(lazy_ostream *)&stack0xffffffffffffff10,(const_string *)(local_118 + 8),
                 0x1d,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffd78);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffd78);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_118._0_8_ = EncodeDouble(in_stack_fffffffffffffd98);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
                 (pointer)in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd78);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                 in_stack_fffffffffffffda0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffffd80,(char (*) [1])in_stack_fffffffffffffd78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
                 (pointer)in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
      in_stack_fffffffffffffd88 = "f2";
      in_stack_fffffffffffffd80 = &local_20;
      in_stack_fffffffffffffd78 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x1cca032;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
                (&stack0xfffffffffffffea8,&stack0xfffffffffffffe98,0x1f,1,2,&local_10);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffd78);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      file = (const_string *)&stack0xfffffffffffffe88;
      line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
                 (pointer)in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
      this = local_188;
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd78);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (this,file,line_num,in_stack_fffffffffffffda0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffffd80,(char (*) [1])in_stack_fffffffffffffd78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
                 (pointer)in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
      in_stack_fffffffffffffd88 = "i2";
      in_stack_fffffffffffffd80 = (lazy_ostream *)local_118;
      in_stack_fffffffffffffd78 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x1c0a206;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_1a8,local_1b8,0x20,1,2,&local_20.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffd78);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
                 (pointer)in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd78);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                 in_stack_fffffffffffffda0);
      std::isnan((double)local_20._vptr_lazy_ostream);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffd88,
                 SUB81((ulong)in_stack_fffffffffffffd80 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
                 (pointer)in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
      boost::unit_test::operator<<
                (in_stack_fffffffffffffd80,(basic_cstring<const_char> *)in_stack_fffffffffffffd78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
                 (pointer)in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
      in_stack_fffffffffffffd78 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_58,local_78,local_98,0x1a,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffd78);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffd78);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_20._8_8_;
}

Assistant:

uint64_t TestDouble(double f) {
    uint64_t i = EncodeDouble(f);
    double f2 = DecodeDouble(i);
    if (std::isnan(f)) {
        // NaN is not guaranteed to round-trip exactly.
        BOOST_CHECK(std::isnan(f2));
    } else {
        // Everything else is.
        BOOST_CHECK(!std::isnan(f2));
        uint64_t i2 = EncodeDouble(f2);
        BOOST_CHECK_EQUAL(f, f2);
        BOOST_CHECK_EQUAL(i, i2);
    }
    return i;
}